

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1651::run(TestCase1651 *this)

{
  ArrayPtr<const_capnp::_::ListReader> lists_00;
  ulong *puVar1;
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  int iVar4;
  PointerType PVar5;
  BuilderArena *arena;
  CapTableBuilder *capTable;
  bool bVar6;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Orphanage OVar7;
  Reader RVar8;
  Fault f;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> cat;
  Reader lists [2];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> list2;
  Orphan<capnproto_test::capnp::test::TestAnyPointer> orphan3;
  Orphan<capnproto_test::capnp::test::TestAnyPointer> orphan2;
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> orphan1;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> list1;
  MallocMessageBuilder message;
  StructReader local_2b8;
  ArrayPtr<const_char> local_288;
  undefined1 local_278 [32];
  ListReader local_258;
  undefined1 local_228 [48];
  ListReader local_1f8;
  ListBuilder local_1c0;
  OrphanBuilder local_198;
  OrphanBuilder local_178;
  OrphanBuilder local_158;
  ListBuilder local_138;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  OVar7 = MessageBuilder::getOrphanage(&local_110.super_MessageBuilder);
  capTable = OVar7.capTable;
  arena = OVar7.arena;
  OrphanBuilder::initStructList((OrphanBuilder *)local_228,arena,capTable,2,(StructSize)0x20001);
  local_158.capTable = (CapTableBuilder *)local_228._16_8_;
  local_158.location = (word *)local_228._24_8_;
  local_158.tag.content = local_228._0_8_;
  local_158.segment = (SegmentBuilder *)local_228._8_8_;
  OrphanBuilder::asStructList(&local_138,&local_158,(StructSize)0x20001);
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_138,0);
  ((CapTableReader *)local_228._16_8_)->_vptr_CapTableReader = (_func_int **)0xc;
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_138,0);
  local_258.segment = (SegmentReader *)local_228._0_8_;
  local_258.capTable = (CapTableReader *)local_228._8_8_;
  local_258.ptr = (byte *)local_228._24_8_;
  RVar8.super_StringPtr.content.size_ = 4;
  RVar8.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_258,RVar8);
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_138,1);
  ((CapTableReader *)local_228._16_8_)->_vptr_CapTableReader = (_func_int **)0x22;
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_138,1);
  local_258.segment = (SegmentReader *)local_228._0_8_;
  local_258.capTable = (CapTableReader *)local_228._8_8_;
  local_258.ptr = (byte *)local_228._24_8_;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_258,value);
  OrphanBuilder::initStruct((OrphanBuilder *)local_228,arena,capTable,(StructSize)0x10000);
  local_178.capTable = (CapTableBuilder *)local_228._16_8_;
  local_178.location = (word *)local_228._24_8_;
  local_178.tag.content = local_228._0_8_;
  local_178.segment = (SegmentBuilder *)local_228._8_8_;
  OrphanBuilder::asStruct((StructBuilder *)local_228,&local_178,(StructSize)0x10000);
  local_258.segment = (SegmentReader *)local_228._0_8_;
  local_258.capTable = (CapTableReader *)local_228._8_8_;
  local_258.ptr = (byte *)local_228._24_8_;
  PointerBuilder::initStructList(&local_1c0,(PointerBuilder *)&local_258,2,(StructSize)0x30002);
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,0);
  ((CapTableReader *)local_228._16_8_)->_vptr_CapTableReader = (_func_int **)&DAT_00000038;
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,0);
  local_258.segment = (SegmentReader *)local_228._0_8_;
  local_258.capTable = (CapTableReader *)local_228._8_8_;
  local_258.ptr = (byte *)local_228._24_8_;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "baz";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_258,value_00);
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,0);
  (((CapTableBuilder *)(local_228._16_8_ + 8))->super_CapTableReader)._vptr_CapTableReader =
       (_func_int **)0x3a0;
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,0);
  local_258.ptr = (byte *)(local_228._24_8_ + 0x10);
  local_258.segment = (SegmentReader *)local_228._0_8_;
  local_258.capTable = (CapTableReader *)local_228._8_8_;
  value_01.super_StringPtr.content.size_ = 6;
  value_01.super_StringPtr.content.ptr = "corge";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_258,value_01);
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,1);
  ((CapTableReader *)local_228._16_8_)->_vptr_CapTableReader = (_func_int **)0x4e;
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,1);
  local_258.segment = (SegmentReader *)local_228._0_8_;
  local_258.capTable = (CapTableReader *)local_228._8_8_;
  local_258.ptr = (byte *)local_228._24_8_;
  value_02.super_StringPtr.content.size_ = 4;
  value_02.super_StringPtr.content.ptr = "qux";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_258,value_02);
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,1);
  (((CapTableBuilder *)(local_228._16_8_ + 8))->super_CapTableReader)._vptr_CapTableReader =
       (_func_int **)0x213;
  ListBuilder::getStructElement((StructBuilder *)local_228,&local_1c0,1);
  local_258.ptr = (byte *)(local_228._24_8_ + 0x10);
  local_258.segment = (SegmentReader *)local_228._0_8_;
  local_258.capTable = (CapTableReader *)local_228._8_8_;
  value_03.super_StringPtr.content.size_ = 7;
  value_03.super_StringPtr.content.ptr = "grault";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_258,value_03);
  OrphanBuilder::asListReader((ListReader *)local_228,&local_158,INLINE_COMPOSITE);
  OrphanBuilder::asStructReader((StructReader *)&local_258,&local_178,(StructSize)0x10000);
  if (local_258.structPointerCount == 0) {
    local_258.nestingLimit = 0x7fffffff;
    local_2b8.capTable = (CapTableReader *)0x0;
    local_2b8.data = (WirePointer *)0x0;
    local_2b8.segment = (SegmentReader *)0x0;
  }
  else {
    local_2b8.data = (void *)CONCAT44(local_258.step,local_258.elementCount);
    local_2b8.capTable = local_258.capTable;
    local_2b8.segment = local_258.segment;
  }
  local_2b8.pointers._0_4_ = local_258.nestingLimit;
  PointerReader::getList(&local_1f8,(PointerReader *)&local_2b8,INLINE_COMPOSITE,(word *)0x0);
  OrphanBuilder::initStruct((OrphanBuilder *)&local_258,arena,capTable,(StructSize)0x10000);
  local_198.capTable = (CapTableBuilder *)local_258.ptr;
  local_198.tag.content = (uint64_t)local_258.segment;
  local_198.segment = (SegmentBuilder *)local_258.capTable;
  OrphanBuilder::asStruct((StructBuilder *)&local_258,&local_198,(StructSize)0x10000);
  pCVar3 = local_258.capTable;
  pSVar2 = local_258.segment;
  puVar1 = (ulong *)CONCAT44(local_258.step,local_258.elementCount);
  OVar7 = MessageBuilder::getOrphanage(&local_110.super_MessageBuilder);
  local_288.size_ = 2;
  local_288.ptr = (char *)local_228;
  lists_00.size_ = 2;
  lists_00.ptr = (ListReader *)local_228;
  OrphanBuilder::concat
            ((OrphanBuilder *)&local_2b8,OVar7.arena,OVar7.capTable,INLINE_COMPOSITE,
             (StructSize)0x20001,lists_00);
  local_278._24_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
  local_278._16_8_ = local_2b8.data;
  local_278._0_8_ = local_2b8.segment;
  local_278._8_8_ = local_2b8.capTable;
  local_2b8.segment = pSVar2;
  local_2b8.capTable = pCVar3;
  local_2b8.data = puVar1;
  PointerBuilder::adopt((PointerBuilder *)&local_2b8,(OrphanBuilder *)local_278);
  if ((SegmentBuilder *)local_278._8_8_ != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)local_278);
  }
  OrphanBuilder::asStructReader(&local_2b8,&local_198,(StructSize)0x10000);
  if (local_2b8.pointerCount == 0) {
    iVar4 = 0x7fffffff;
    local_278._8_8_ = (SegmentBuilder *)0x0;
    local_278._16_8_ = (WirePointer *)0x0;
    local_278._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
    local_278._8_8_ = local_2b8.capTable;
    local_278._0_8_ = local_2b8.segment;
    iVar4 = local_2b8.nestingLimit;
  }
  local_278._24_4_ = iVar4;
  PointerReader::getList(&local_258,(PointerReader *)local_278,INLINE_COMPOSITE,(word *)0x0);
  if (local_258.elementCount == 4) {
    ListReader::getStructElement(&local_2b8,&local_258,0);
    bVar6 = true;
    if (0x3f < local_2b8.dataSize) {
      bVar6 = *local_2b8.data != 0xc;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0xc;
      ListReader::getStructElement(&local_2b8,&local_258,0);
      if (local_2b8.dataSize < 0x40) {
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._0_8_ = *local_2b8.data;
      }
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x699,ERROR,
                 "\"failed: expected \" \"(12) == (cat[0].getOld1())\", 12, cat[0].getOld1()",
                 (char (*) [44])"failed: expected (12) == (cat[0].getOld1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,0);
    if (local_2b8.pointerCount == 0) {
      iVar4 = 0x7fffffff;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
      local_278._8_8_ = local_2b8.capTable;
      local_278._0_8_ = local_2b8.segment;
      iVar4 = local_2b8.nestingLimit;
    }
    local_278._24_4_ = iVar4;
    RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
    if (((RVar8.super_StringPtr.content.size_ != 4) ||
        (iVar4 = bcmp(RVar8.super_StringPtr.content.ptr,"foo",3), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      ListReader::getStructElement(&local_2b8,&local_258,0);
      if (local_2b8.pointerCount == 0) {
        iVar4 = 0x7fffffff;
        local_278._8_8_ = (SegmentBuilder *)0x0;
        local_278._16_8_ = (WirePointer *)0x0;
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
        local_278._8_8_ = local_2b8.capTable;
        local_278._0_8_ = local_2b8.segment;
        iVar4 = local_2b8.nestingLimit;
      }
      local_278._24_4_ = iVar4;
      local_288 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69a,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (cat[0].getOld2())\", \"foo\", cat[0].getOld2()"
                 ,(char (*) [47])"failed: expected (\"foo\") == (cat[0].getOld2())",
                 (char (*) [4])"foo",(Reader *)&local_288);
    }
    ListReader::getStructElement(&local_2b8,&local_258,0);
    if (local_2b8.dataSize < 0x80) {
      bVar6 = false;
    }
    else {
      bVar6 = *(ulong *)((long)local_2b8.data + 8) != 0;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0x3db;
      ListReader::getStructElement(&local_2b8,&local_258,0);
      local_278._0_8_ = (SegmentReader *)0x3db;
      if (0x7f < local_2b8.dataSize) {
        local_278._0_8_ = *(ulong *)((long)local_2b8.data + 8) ^ 0x3db;
      }
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69b,ERROR,
                 "\"failed: expected \" \"(987) == (cat[0].getNew1())\", 987, cat[0].getNew1()",
                 (char (*) [45])"failed: expected (987) == (cat[0].getNew1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,0);
    if (local_2b8.pointerCount < 3) {
      local_278._0_8_ = (SegmentReader *)0x0;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._24_4_ = 0x7fffffff;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers) + 0x10;
      local_278._0_8_ = local_2b8.segment;
      local_278._8_8_ = local_2b8.capTable;
      local_278._24_4_ = local_2b8.nestingLimit;
    }
    PVar5 = PointerReader::getPointerType((PointerReader *)local_278);
    if ((PVar5 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69c,ERROR,"\"failed: expected \" \"!(cat[0].hasNew2())\"",
                 (char (*) [37])"failed: expected !(cat[0].hasNew2())");
    }
    ListReader::getStructElement(&local_2b8,&local_258,1);
    bVar6 = true;
    if (0x3f < local_2b8.dataSize) {
      bVar6 = *local_2b8.data != 0x22;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0x22;
      ListReader::getStructElement(&local_2b8,&local_258,1);
      if (local_2b8.dataSize < 0x40) {
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._0_8_ = *local_2b8.data;
      }
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69e,ERROR,
                 "\"failed: expected \" \"(34) == (cat[1].getOld1())\", 34, cat[1].getOld1()",
                 (char (*) [44])"failed: expected (34) == (cat[1].getOld1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,1);
    if (local_2b8.pointerCount == 0) {
      iVar4 = 0x7fffffff;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
      local_278._8_8_ = local_2b8.capTable;
      local_278._0_8_ = local_2b8.segment;
      iVar4 = local_2b8.nestingLimit;
    }
    local_278._24_4_ = iVar4;
    RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
    if (((RVar8.super_StringPtr.content.size_ != 4) ||
        (iVar4 = bcmp(RVar8.super_StringPtr.content.ptr,"bar",3), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      ListReader::getStructElement(&local_2b8,&local_258,1);
      if (local_2b8.pointerCount == 0) {
        iVar4 = 0x7fffffff;
        local_278._8_8_ = (SegmentBuilder *)0x0;
        local_278._16_8_ = (WirePointer *)0x0;
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
        local_278._8_8_ = local_2b8.capTable;
        local_278._0_8_ = local_2b8.segment;
        iVar4 = local_2b8.nestingLimit;
      }
      local_278._24_4_ = iVar4;
      local_288 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69f,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (cat[1].getOld2())\", \"bar\", cat[1].getOld2()"
                 ,(char (*) [47])"failed: expected (\"bar\") == (cat[1].getOld2())",
                 (char (*) [4])0x2be72e,(Reader *)&local_288);
    }
    ListReader::getStructElement(&local_2b8,&local_258,1);
    if (local_2b8.dataSize < 0x80) {
      bVar6 = false;
    }
    else {
      bVar6 = *(ulong *)((long)local_2b8.data + 8) != 0;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0x3db;
      ListReader::getStructElement(&local_2b8,&local_258,1);
      local_278._0_8_ = (SegmentReader *)0x3db;
      if (0x7f < local_2b8.dataSize) {
        local_278._0_8_ = *(ulong *)((long)local_2b8.data + 8) ^ 0x3db;
      }
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a0,ERROR,
                 "\"failed: expected \" \"(987) == (cat[1].getNew1())\", 987, cat[1].getNew1()",
                 (char (*) [45])"failed: expected (987) == (cat[1].getNew1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,1);
    if (local_2b8.pointerCount < 3) {
      local_278._0_8_ = (SegmentReader *)0x0;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._24_4_ = 0x7fffffff;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers) + 0x10;
      local_278._0_8_ = local_2b8.segment;
      local_278._8_8_ = local_2b8.capTable;
      local_278._24_4_ = local_2b8.nestingLimit;
    }
    PVar5 = PointerReader::getPointerType((PointerReader *)local_278);
    if ((PVar5 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a1,ERROR,"\"failed: expected \" \"!(cat[1].hasNew2())\"",
                 (char (*) [37])"failed: expected !(cat[1].hasNew2())");
    }
    ListReader::getStructElement(&local_2b8,&local_258,2);
    bVar6 = true;
    if (0x3f < local_2b8.dataSize) {
      bVar6 = *local_2b8.data != 0x38;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0x38;
      ListReader::getStructElement(&local_2b8,&local_258,2);
      if (local_2b8.dataSize < 0x40) {
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._0_8_ = *local_2b8.data;
      }
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a3,ERROR,
                 "\"failed: expected \" \"(56) == (cat[2].getOld1())\", 56, cat[2].getOld1()",
                 (char (*) [44])"failed: expected (56) == (cat[2].getOld1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,2);
    if (local_2b8.pointerCount == 0) {
      iVar4 = 0x7fffffff;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
      local_278._8_8_ = local_2b8.capTable;
      local_278._0_8_ = local_2b8.segment;
      iVar4 = local_2b8.nestingLimit;
    }
    local_278._24_4_ = iVar4;
    RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
    if (((RVar8.super_StringPtr.content.size_ != 4) ||
        (iVar4 = bcmp(RVar8.super_StringPtr.content.ptr,"baz",3), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      ListReader::getStructElement(&local_2b8,&local_258,2);
      if (local_2b8.pointerCount == 0) {
        iVar4 = 0x7fffffff;
        local_278._8_8_ = (SegmentBuilder *)0x0;
        local_278._16_8_ = (WirePointer *)0x0;
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
        local_278._8_8_ = local_2b8.capTable;
        local_278._0_8_ = local_2b8.segment;
        iVar4 = local_2b8.nestingLimit;
      }
      local_278._24_4_ = iVar4;
      local_288 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a4,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (cat[2].getOld2())\", \"baz\", cat[2].getOld2()"
                 ,(char (*) [47])"failed: expected (\"baz\") == (cat[2].getOld2())",
                 (char (*) [4])0x2c5c46,(Reader *)&local_288);
    }
    ListReader::getStructElement(&local_2b8,&local_258,2);
    bVar6 = true;
    if (0x7f < local_2b8.dataSize) {
      bVar6 = *(ulong *)((long)local_2b8.data + 8) != 0x3a0;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0x7b;
      ListReader::getStructElement(&local_2b8,&local_258,2);
      local_278._0_8_ = (SegmentReader *)0x3db;
      if (0x7f < local_2b8.dataSize) {
        local_278._0_8_ = *(ulong *)((long)local_2b8.data + 8) ^ 0x3db;
      }
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a5,ERROR,
                 "\"failed: expected \" \"(123) == (cat[2].getNew1())\", 123, cat[2].getNew1()",
                 (char (*) [45])"failed: expected (123) == (cat[2].getNew1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,2);
    if (local_2b8.pointerCount < 3) {
      iVar4 = 0x7fffffff;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers) + 0x10;
      local_278._8_8_ = local_2b8.capTable;
      local_278._0_8_ = local_2b8.segment;
      iVar4 = local_2b8.nestingLimit;
    }
    local_278._24_4_ = iVar4;
    RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,&DAT_002f97e8,3);
    if (((RVar8.super_StringPtr.content.size_ != 6) ||
        (iVar4 = bcmp(RVar8.super_StringPtr.content.ptr,"corge",5), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      ListReader::getStructElement(&local_2b8,&local_258,2);
      if (local_2b8.pointerCount < 3) {
        iVar4 = 0x7fffffff;
        local_278._8_8_ = (SegmentBuilder *)0x0;
        local_278._16_8_ = (WirePointer *)0x0;
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers) + 0x10;
        local_278._8_8_ = local_2b8.capTable;
        local_278._0_8_ = local_2b8.segment;
        iVar4 = local_2b8.nestingLimit;
      }
      local_278._24_4_ = iVar4;
      local_288 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,&DAT_002f97e8,3);
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a6,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (cat[2].getNew2())\", \"corge\", cat[2].getNew2()"
                 ,(char (*) [49])"failed: expected (\"corge\") == (cat[2].getNew2())",
                 (char (*) [6])"corge",(Reader *)&local_288);
    }
    ListReader::getStructElement(&local_2b8,&local_258,3);
    bVar6 = true;
    if (0x3f < local_2b8.dataSize) {
      bVar6 = *local_2b8.data != 0x4e;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0x4e;
      ListReader::getStructElement(&local_2b8,&local_258,3);
      if (local_2b8.dataSize < 0x40) {
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._0_8_ = *local_2b8.data;
      }
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a8,ERROR,
                 "\"failed: expected \" \"(78) == (cat[3].getOld1())\", 78, cat[3].getOld1()",
                 (char (*) [44])"failed: expected (78) == (cat[3].getOld1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,3);
    if (local_2b8.pointerCount == 0) {
      iVar4 = 0x7fffffff;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
      local_278._8_8_ = local_2b8.capTable;
      local_278._0_8_ = local_2b8.segment;
      iVar4 = local_2b8.nestingLimit;
    }
    local_278._24_4_ = iVar4;
    RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
    if (((RVar8.super_StringPtr.content.size_ != 4) ||
        (iVar4 = bcmp(RVar8.super_StringPtr.content.ptr,"qux",3), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      ListReader::getStructElement(&local_2b8,&local_258,3);
      if (local_2b8.pointerCount == 0) {
        iVar4 = 0x7fffffff;
        local_278._8_8_ = (SegmentBuilder *)0x0;
        local_278._16_8_ = (WirePointer *)0x0;
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers);
        local_278._8_8_ = local_2b8.capTable;
        local_278._0_8_ = local_2b8.segment;
        iVar4 = local_2b8.nestingLimit;
      }
      local_278._24_4_ = iVar4;
      local_288 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a9,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (cat[3].getOld2())\", \"qux\", cat[3].getOld2()"
                 ,(char (*) [47])"failed: expected (\"qux\") == (cat[3].getOld2())",
                 (char (*) [4])0x2cb625,(Reader *)&local_288);
    }
    ListReader::getStructElement(&local_2b8,&local_258,3);
    bVar6 = true;
    if (0x7f < local_2b8.dataSize) {
      bVar6 = *(ulong *)((long)local_2b8.data + 8) != 0x213;
    }
    if ((bVar6) && (kj::_::Debug::minSeverity < 3)) {
      local_288.ptr._0_4_ = 0x1c8;
      ListReader::getStructElement(&local_2b8,&local_258,3);
      local_278._0_8_ = (SegmentReader *)0x3db;
      if (0x7f < local_2b8.dataSize) {
        local_278._0_8_ = *(ulong *)((long)local_2b8.data + 8) ^ 0x3db;
      }
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6aa,ERROR,
                 "\"failed: expected \" \"(456) == (cat[3].getNew1())\", 456, cat[3].getNew1()",
                 (char (*) [45])"failed: expected (456) == (cat[3].getNew1())",(int *)&local_288,
                 (long *)local_278);
    }
    ListReader::getStructElement(&local_2b8,&local_258,3);
    if (local_2b8.pointerCount < 3) {
      iVar4 = 0x7fffffff;
      local_278._8_8_ = (SegmentBuilder *)0x0;
      local_278._16_8_ = (WirePointer *)0x0;
      local_278._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers) + 0x10;
      local_278._8_8_ = local_2b8.capTable;
      local_278._0_8_ = local_2b8.segment;
      iVar4 = local_2b8.nestingLimit;
    }
    local_278._24_4_ = iVar4;
    RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,&DAT_002f97e8,3);
    if (((RVar8.super_StringPtr.content.size_ != 7) ||
        (iVar4 = bcmp(RVar8.super_StringPtr.content.ptr,"grault",6), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      ListReader::getStructElement(&local_2b8,&local_258,3);
      if (local_2b8.pointerCount < 3) {
        local_2b8.nestingLimit = 0x7fffffff;
        local_278._8_8_ = (SegmentBuilder *)0x0;
        local_278._16_8_ = (WirePointer *)0x0;
        local_278._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_278._16_8_ = CONCAT44(local_2b8.pointers._4_4_,(int)local_2b8.pointers) + 0x10;
        local_278._8_8_ = local_2b8.capTable;
        local_278._0_8_ = local_2b8.segment;
      }
      local_278._24_4_ = local_2b8.nestingLimit;
      local_288 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)local_278,&DAT_002f97e8,3);
      kj::_::Debug::log<char_const(&)[50],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6ab,ERROR,
                 "\"failed: expected \" \"(\\\"grault\\\") == (cat[3].getNew2())\", \"grault\", cat[3].getNew2()"
                 ,(char (*) [50])"failed: expected (\"grault\") == (cat[3].getNew2())",
                 (char (*) [7])"grault",(Reader *)&local_288);
    }
    if (local_198.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&local_198);
    }
    if (local_178.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&local_178);
    }
    if (local_158.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&local_158);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&local_110);
    return;
  }
  local_278._0_4_ = 4;
  local_288.ptr._0_4_ = local_258.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
            ((Fault *)&local_2b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x697,FAILED,"(4) == (cat.size())","4, cat.size()",(int *)local_278,(uint *)&local_288
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_2b8);
}

Assistant:

TEST(Orphans, ConcatenateStructLists) {
  // In this test, we not only concatenate two struct lists, but we concatenate in a list that
  // contains a newer-than-expected version of the struct with extra fields, in order to verify
  // that the new fields aren't lost.

  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto orphan1 = orphanage.newOrphan<List<test::TestOldVersion>>(2);
  auto list1 = orphan1.get();
  list1[0].setOld1(12);
  list1[0].setOld2("foo");
  list1[1].setOld1(34);
  list1[1].setOld2("bar");

  auto orphan2 = orphanage.newOrphan<test::TestAnyPointer>();
  auto list2 = orphan2.get().getAnyPointerField().initAs<List<test::TestNewVersion>>(2);
  list2[0].setOld1(56);
  list2[0].setOld2("baz");
  list2[0].setNew1(123);
  list2[0].setNew2("corge");
  list2[1].setOld1(78);
  list2[1].setOld2("qux");
  list2[1].setNew1(456);
  list2[1].setNew2("grault");

  List<test::TestOldVersion>::Reader lists[] = {
    orphan1.getReader(),
    orphan2.getReader().getAnyPointerField().getAs<List<test::TestOldVersion>>()
  };
  kj::ArrayPtr<List<test::TestOldVersion>::Reader> array = lists;

  auto orphan3 = orphanage.newOrphan<test::TestAnyPointer>();
  orphan3.get().getAnyPointerField().adopt(message.getOrphanage().newOrphanConcat(array));

  auto cat = orphan3.getReader().getAnyPointerField().getAs<List<test::TestNewVersion>>();
  ASSERT_EQ(4, cat.size());

  EXPECT_EQ(12, cat[0].getOld1());
  EXPECT_EQ("foo", cat[0].getOld2());
  EXPECT_EQ(987, cat[0].getNew1());
  EXPECT_FALSE(cat[0].hasNew2());

  EXPECT_EQ(34, cat[1].getOld1());
  EXPECT_EQ("bar", cat[1].getOld2());
  EXPECT_EQ(987, cat[1].getNew1());
  EXPECT_FALSE(cat[1].hasNew2());

  EXPECT_EQ(56, cat[2].getOld1());
  EXPECT_EQ("baz", cat[2].getOld2());
  EXPECT_EQ(123, cat[2].getNew1());
  EXPECT_EQ("corge", cat[2].getNew2());

  EXPECT_EQ(78, cat[3].getOld1());
  EXPECT_EQ("qux", cat[3].getOld2());
  EXPECT_EQ(456, cat[3].getNew1());
  EXPECT_EQ("grault", cat[3].getNew2());
}